

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall CGameClient::UpdatePositions(CGameClient *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  CNetObj_SpectatorInfo *pCVar12;
  CNetObj_SpectatorInfo *pCVar13;
  vec2 vVar14;
  vec2 vVar15;
  CCharacterInfo *pCVar16;
  bool Predicted;
  int iVar17;
  long lVar18;
  vec2 vVar19;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar20;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar21;
  
  if (((this->m_Snap).m_pLocalCharacter != (CNetObj_Character *)0x0) &&
     ((this->m_Snap).m_pLocalPrevCharacter != (CNetObj_Character *)0x0)) {
    iVar17 = this->m_LocalClientID;
    Predicted = ShouldUsePredicted(this);
    vVar19 = GetCharPos(this,iVar17,Predicted);
    this->m_LocalCharacterPos = vVar19;
  }
  if ((this->m_Snap).m_SpecInfo.m_Active != true) {
    return;
  }
  if (((this->m_pClient->m_State == 4) &&
      (iVar17 = (*(this->m_pDemoPlayer->super_IInterface)._vptr_IInterface[10])(), iVar17 == 2)) &&
     (lVar18 = (long)(this->m_Snap).m_SpecInfo.m_SpectatorID, lVar18 != -1)) {
    pCVar16 = (this->m_Snap).m_aCharacters + lVar18;
    uVar2 = (pCVar16->m_Prev).super_CNetObj_CharacterCore.m_X;
    uVar7 = (pCVar16->m_Prev).super_CNetObj_CharacterCore.m_Y;
    pCVar16 = (this->m_Snap).m_aCharacters + lVar18;
    uVar3 = (pCVar16->m_Cur).super_CNetObj_CharacterCore.m_X;
    uVar8 = (pCVar16->m_Cur).super_CNetObj_CharacterCore.m_Y;
    fVar1 = this->m_pClient->m_GameIntraTick;
    aVar20.x = fVar1 * ((float)(int)uVar3 - (float)(int)uVar2) + (float)(int)uVar2;
    aVar21.y = fVar1 * ((float)(int)uVar8 - (float)(int)uVar7) + (float)(int)uVar7;
    vVar14.field_1.y = aVar21.y;
    vVar14.field_0.x = aVar20.x;
    (this->m_Snap).m_SpecInfo.m_Position = vVar14;
    vVar15.field_1.y = aVar21.y;
    vVar15.field_0.x = aVar20.x;
    this->m_LocalCharacterPos = vVar15;
  }
  else {
    pCVar12 = (this->m_Snap).m_pSpectatorInfo;
    if (pCVar12 == (CNetObj_SpectatorInfo *)0x0) {
      return;
    }
    if ((this->m_pClient->m_State != 4) && ((this->m_Snap).m_SpecInfo.m_SpecMode == 0)) {
      return;
    }
    pCVar13 = (this->m_Snap).m_pPrevSpectatorInfo;
    if (pCVar13 == (CNetObj_SpectatorInfo *)0x0) {
      uVar6 = pCVar12->m_X;
      uVar11 = pCVar12->m_Y;
      vVar19.field_0.x = (float)(int)uVar6;
      vVar19.field_1.y = (float)(int)uVar11;
    }
    else {
      uVar4 = pCVar13->m_X;
      uVar9 = pCVar13->m_Y;
      uVar5 = pCVar12->m_X;
      uVar10 = pCVar12->m_Y;
      fVar1 = this->m_pClient->m_GameIntraTick;
      vVar19.field_0.x = fVar1 * ((float)(int)uVar5 - (float)(int)uVar4) + (float)(int)uVar4;
      vVar19.field_1.y = fVar1 * ((float)(int)uVar10 - (float)(int)uVar9) + (float)(int)uVar9;
    }
    (this->m_Snap).m_SpecInfo.m_Position = vVar19;
    this->m_LocalCharacterPos = vVar19;
  }
  (this->m_Snap).m_SpecInfo.m_UsePosition = true;
  return;
}

Assistant:

void CGameClient::UpdatePositions()
{
	// `m_LocalCharacterPos` is used for many things besides rendering the
	// player (e.g. camera position, mouse input), which is why we set it here.
	if(m_Snap.m_pLocalCharacter && m_Snap.m_pLocalPrevCharacter)
	{
		m_LocalCharacterPos = GetCharPos(m_LocalClientID, ShouldUsePredicted());
	}

	// spectator position
	if(m_Snap.m_SpecInfo.m_Active)
	{
		if(Client()->State() == IClient::STATE_DEMOPLAYBACK &&
			DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER &&
			m_Snap.m_SpecInfo.m_SpectatorID != -1)
		{
			m_Snap.m_SpecInfo.m_Position = GetCharPos(m_Snap.m_SpecInfo.m_SpectatorID);
			m_LocalCharacterPos = m_Snap.m_SpecInfo.m_Position;
			m_Snap.m_SpecInfo.m_UsePosition = true;
		}
		else if(
			m_Snap.m_pSpectatorInfo &&
			(
				Client()->State() == IClient::STATE_DEMOPLAYBACK ||
				m_Snap.m_SpecInfo.m_SpecMode != SPEC_FREEVIEW ||
				(
					m_Snap.m_pLocalInfo &&
					(m_Snap.m_pLocalInfo->m_PlayerFlags & PLAYERFLAG_DEAD) &&
					m_Snap.m_SpecInfo.m_SpecMode != SPEC_FREEVIEW
				)
			))
		{
			if(m_Snap.m_pPrevSpectatorInfo)
				m_Snap.m_SpecInfo.m_Position = mix(
					vec2(
						m_Snap.m_pPrevSpectatorInfo->m_X,
						m_Snap.m_pPrevSpectatorInfo->m_Y
					),
					vec2(
						m_Snap.m_pSpectatorInfo->m_X,
						m_Snap.m_pSpectatorInfo->m_Y
					),
					Client()->IntraGameTick()
				);
			else
				m_Snap.m_SpecInfo.m_Position = vec2(
					m_Snap.m_pSpectatorInfo->m_X,
					m_Snap.m_pSpectatorInfo->m_Y
				);

			m_LocalCharacterPos = m_Snap.m_SpecInfo.m_Position;
			m_Snap.m_SpecInfo.m_UsePosition = true;
		}
	}
}